

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O2

void scale16(pced *out,int pow,int x)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong local_98 [3];
  pced R;
  
  R.sum[4] = 0;
  R.prod[0] = 0;
  R.sum[2] = 0;
  R.sum[3] = 0;
  R.sum[0] = 0;
  R.sum[1] = 0;
  R.diff[3] = 0;
  R.diff[4] = 0;
  R.diff[1] = 0;
  R.diff[2] = 0;
  local_98[2] = 0;
  R.diff[0] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  R.prod[1] = 0;
  iVar2 = 1 - ((uint)x >> 2 & 2);
  uVar3 = x * iVar2;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    if (((uVar3 >> 2 | uVar3) & 3) == 0) {
      uVar5 = pced_zero.diff[lVar7];
      uVar4 = pced_zero.sum[lVar7];
      uVar8 = pced_zero.prod[lVar7];
    }
    else {
      uVar5 = 0;
      uVar4 = 0;
      uVar8 = 0;
    }
    local_98[lVar7] = local_98[lVar7] ^ uVar5;
    R.diff[lVar7 + 2] = R.diff[lVar7 + 2] ^ uVar4;
    R.sum[lVar7 + 2] = R.sum[lVar7 + 2] ^ uVar8;
  }
  lVar7 = (long)(pow >> 1) * 0x3c0 + 0x104390;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    uVar3 = uVar3 - 1;
    for (lVar9 = -0x28; lVar9 != 0; lVar9 = lVar9 + 8) {
      if (((uVar3 >> 2 | uVar3) & 3) == 0) {
        uVar5 = *(ulong *)(lVar7 + -0x28 + lVar9);
        uVar4 = *(ulong *)(lVar7 + lVar9);
        uVar8 = *(ulong *)(lVar7 + 0x28 + lVar9);
      }
      else {
        uVar5 = 0;
        uVar4 = 0;
        uVar8 = 0;
      }
      puVar1 = (ulong *)((long)R.diff + lVar9 + 0x10);
      *puVar1 = *puVar1 ^ uVar5;
      puVar1 = (ulong *)((long)R.sum + lVar9 + 0x10);
      *puVar1 = *puVar1 ^ uVar4;
      puVar1 = (ulong *)((long)R.prod + lVar9 + 0x10);
      *puVar1 = *puVar1 ^ uVar8;
    }
    lVar7 = lVar7 + 0x78;
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    uVar5 = local_98[lVar7];
    uVar4 = R.diff[lVar7 + 2];
    bVar10 = ((uint)x >> 3 & 1) != 0;
    uVar8 = uVar5;
    if (bVar10) {
      uVar8 = uVar4;
    }
    out->diff[lVar7] = uVar8;
    if (bVar10) {
      uVar4 = uVar5;
    }
    out->sum[lVar7] = uVar4;
    out->prod[lVar7] = R.sum[lVar7 + 2] * (long)iVar2;
  }
  return;
}

Assistant:

static void
scale16(struct pced *out, int pow, int x)
{
	struct pced R = { { 0 }, { 0 }, { 0 } };
	limb_t mA, mB, mask;
	int neg, sgnx, absx;
	int i, k;
	
	neg = (x >> 3) & 1;
	sgnx = 1 - 2*neg;
	absx = sgnx * x;
	pow >>= 1;

	/* handle abs(x) == 0 */
	mask = absx | (absx >> 2);
	mask |= mask >> 1;
	mask = (mask & 1) - 1;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		R.diff[i] ^= pced_zero.diff[i] & mask;
		R.sum[i] ^= pced_zero.sum[i] & mask;
		R.prod[i] ^= pced_zero.prod[i] & mask;
	}


	/* go through our table and look for abs(x) */
	for (k = 0; k < 8; k++) {
		absx--;
		mask = absx | (absx >> 2);
		mask |= mask >> 1;
		mask = (mask & 1) - 1;
		for (i = 0; i < FLD_LIMB_NUM; i++) {
			R.diff[i] ^= ed_lookup[pow][k].diff[i] & mask;
			R.sum[i] ^= ed_lookup[pow][k].sum[i] & mask;
			R.prod[i] ^= ed_lookup[pow][k].prod[i] & mask;
		}
	}

	/* conditionally negate R and write to out */
	mA = neg-1;
	mB = ~mA;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		out->diff[i] = (mA & R.diff[i]) ^ (mB & R.sum[i]);
		out->sum[i]  = (mB & R.diff[i]) ^ (mA & R.sum[i]);
		out->prod[i] = sgnx * R.prod[i];
	}
}